

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataExpression.cpp
# Opt level: O0

bool __thiscall
Rml::DataExpression::Run
          (DataExpression *this,DataExpressionInterface *expression_interface,Variant *out_value)

{
  bool bVar1;
  Variant local_110;
  undefined4 local_e8;
  DataModel *local_d8;
  Element *pEStack_d0;
  Event *local_c8;
  undefined1 local_b8 [8];
  DataInterpreter interpreter;
  Variant *out_value_local;
  DataExpressionInterface *expression_interface_local;
  DataExpression *this_local;
  
  local_c8 = expression_interface->event;
  local_d8 = expression_interface->data_model;
  pEStack_d0 = expression_interface->element;
  interpreter.expression_interface.event = (Event *)out_value;
  DataInterpreter::DataInterpreter
            ((DataInterpreter *)local_b8,&this->program,&this->addresses,*expression_interface);
  bVar1 = DataInterpreter::Run((DataInterpreter *)local_b8);
  if (bVar1) {
    DataInterpreter::Result(&local_110,(DataInterpreter *)local_b8);
    Variant::operator=((Variant *)interpreter.expression_interface.event,&local_110);
    Variant::~Variant(&local_110);
  }
  local_e8 = 1;
  DataInterpreter::~DataInterpreter((DataInterpreter *)local_b8);
  return bVar1;
}

Assistant:

bool DataExpression::Run(const DataExpressionInterface& expression_interface, Variant& out_value)
{
	DataInterpreter interpreter(program, addresses, expression_interface);

	if (!interpreter.Run())
		return false;

	out_value = interpreter.Result();
	return true;
}